

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogComboBox::setHistory(QFileDialogComboBox *this,QStringList *paths)

{
  QFileSystemModel *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArrayView QVar4;
  QUrl url;
  QArrayData *local_e8;
  char16_t *pcStack_e0;
  undefined8 local_d8;
  QArrayData *local_d0;
  QArrayData *local_b8 [3];
  QUrl local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  long *local_88;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<QString>::operator=(&(this->m_history).d,&paths->d);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_78.size = 0;
  local_88 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->d_ptr->model;
  if (pQVar1 == (QFileSystemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = L"/";
    local_58._16_8_ = 1;
  }
  else {
    QFileSystemModel::rootPath();
  }
  QFileSystemModel::index((QString *)&local_98,(int)pQVar1);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  local_a0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  bVar3 = false;
  if ((-1 < (int)local_98) && (bVar3 = false, -1 < (long)local_98)) {
    bVar3 = local_88 != (long *)0x0;
  }
  if (bVar3) {
    if (local_88 == (long *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (char16_t *)0x0;
      local_58._16_8_ = 0;
      local_40 = 2;
    }
    else {
      (**(code **)(*local_88 + 0x90))(&local_58,local_88,&local_98,0x101);
    }
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)local_b8);
    QUrl::fromLocalFile((QString *)&local_a0);
  }
  else {
    QVar4.m_data = (storage_type *)0x5;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar4);
    local_e8 = (QArrayData *)local_58.shared;
    pcStack_e0 = (char16_t *)local_58._8_8_;
    local_d8 = local_58._16_8_;
    QUrl::QUrl(&local_a0,(QString *)&local_e8,TolerantMode);
  }
  if (bVar3) {
    if (local_b8[0] != (QArrayData *)0x0) {
      LOCK();
      (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8[0],2,0x10);
      }
    }
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else if (local_e8 != (QArrayData *)0x0) {
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_e8,2,0x10);
    }
  }
  cVar2 = QUrl::isValid();
  if (cVar2 != '\0') {
    QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
              ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_a0);
    QList<QUrl>::end((QList<QUrl> *)&local_78);
  }
  QUrlModel::setUrls(this->urlModel,(QList<QUrl> *)&local_78);
  QUrl::~QUrl(&local_a0);
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogComboBox::setHistory(const QStringList &paths)
{
    m_history = paths;
    // Only populate the first item, showPopup will populate the rest if needed
    QList<QUrl> list;
    const QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    //On windows the popup display the "C:\", convert to nativeSeparators
    const QUrl url = idx.isValid()
                   ? QUrl::fromLocalFile(QDir::toNativeSeparators(idx.data(QFileSystemModel::FilePathRole).toString()))
                   : QUrl("file:"_L1);
    if (url.isValid())
        list.append(url);
    urlModel->setUrls(list);
}